

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastq_parser.hpp
# Opt level: O1

vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
* __thiscall
bioparser::FastqParser<biosoup::NucleicAcid>::Parse
          (vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
           *__return_storage_ptr__,FastqParser<biosoup::NucleicAcid> *this,uint64_t bytes,
          bool shorten_names)

{
  uint32_t *puVar1;
  char cVar2;
  pointer pcVar3;
  bool bVar4;
  vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
  *pvVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  uint32_t count;
  ulong uVar9;
  bool bVar10;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  uint32_t quality_ptr;
  uint32_t comment_ptr;
  uint32_t data_ptr;
  uint64_t parsed_bytes;
  anon_class_56_7_9b2cff2a create_T;
  bool local_9d;
  uint32_t local_9c;
  uint32_t local_98;
  uint32_t local_94;
  vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
  *local_90;
  ulong local_88;
  ulong local_80;
  uint64_t local_78;
  uint64_t local_70;
  anon_class_56_7_9b2cff2a local_68;
  
  local_68.shorten_names = &local_9d;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.parsed_bytes = &local_70;
  local_70 = 0;
  local_68.data_ptr = &local_94;
  local_94 = 0;
  local_68.comment_ptr = &local_98;
  local_98 = 0;
  local_68.quality_ptr = &local_9c;
  local_80 = 0;
  local_9c = 0;
  bVar4 = true;
  bVar12 = false;
  bVar10 = false;
  bVar6 = false;
  local_88 = 0;
  local_9d = shorten_names;
  local_90 = __return_storage_ptr__;
  local_78 = bytes;
  local_68.this = this;
  local_68.dst = __return_storage_ptr__;
  do {
    uVar8 = (this->super_Parser<biosoup::NucleicAcid>).buffer_ptr_;
    uVar9 = (ulong)uVar8;
    uVar11 = uVar9;
    if (uVar8 < (this->super_Parser<biosoup::NucleicAcid>).buffer_bytes_) {
      do {
        cVar2 = (this->super_Parser<biosoup::NucleicAcid>).buffer_.
                super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar11];
        if (cVar2 == '\n') {
          Parser<biosoup::NucleicAcid>::Store
                    (&this->super_Parser<biosoup::NucleicAcid>,
                     (int)uVar9 - (this->super_Parser<biosoup::NucleicAcid>).buffer_ptr_,
                     (bool)~bVar4);
          if (bVar4) {
            local_94 = (this->super_Parser<biosoup::NucleicAcid>).storage_ptr_;
            bVar12 = true;
            bVar4 = false;
          }
          else {
            if (!bVar10) {
              bVar13 = true;
              if ((bVar6) &&
                 (bVar13 = true,
                 (this->super_Parser<biosoup::NucleicAcid>).storage_ptr_ - local_9c ==
                 local_98 - local_94)) {
                Parse::anon_class_56_7_9b2cff2a::operator()(&local_68);
                bVar13 = local_70 < local_78;
                local_88 = CONCAT71((int7)(local_88 >> 8),(byte)local_88 | !bVar13);
                bVar4 = true;
                bVar6 = false;
              }
              goto LAB_00107f7f;
            }
            local_9c = (this->super_Parser<biosoup::NucleicAcid>).storage_ptr_;
            bVar6 = true;
            bVar10 = false;
          }
LAB_00107f7d:
          bVar13 = true;
        }
        else {
          bVar13 = true;
          if ((cVar2 == '+') && (bVar12)) {
            local_98 = (this->super_Parser<biosoup::NucleicAcid>).storage_ptr_;
            bVar10 = true;
            bVar12 = false;
            goto LAB_00107f7d;
          }
        }
LAB_00107f7f:
        if (!bVar13) {
          iVar7 = 1;
          goto LAB_0010804e;
        }
        uVar11 = uVar11 + 1;
        uVar8 = (int)uVar9 + 1;
        uVar9 = (ulong)uVar8;
      } while (uVar11 < (this->super_Parser<biosoup::NucleicAcid>).buffer_bytes_);
    }
    puVar1 = &(this->super_Parser<biosoup::NucleicAcid>).buffer_ptr_;
    count = uVar8 - *puVar1;
    if (*puVar1 <= uVar8 && count != 0) {
      Parser<biosoup::NucleicAcid>::Store
                (&this->super_Parser<biosoup::NucleicAcid>,count,(bool)~bVar4);
    }
    iVar7 = 3;
    if ((local_80 & 1) == 0) {
      (this->super_Parser<biosoup::NucleicAcid>).buffer_ptr_ = 0;
      pcVar3 = (this->super_Parser<biosoup::NucleicAcid>).buffer_.
               super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_start;
      uVar8 = gzread((this->super_Parser<biosoup::NucleicAcid>).file_._M_t.
                     super___uniq_ptr_impl<gzFile_s,_int_(*)(gzFile_s_*)>._M_t.
                     super__Tuple_impl<0UL,_gzFile_s_*,_int_(*)(gzFile_s_*)>.
                     super__Head_base<0UL,_gzFile_s_*,_false>._M_head_impl,pcVar3,
                     *(int *)&(this->super_Parser<biosoup::NucleicAcid>).buffer_.
                              super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_finish - (int)pcVar3);
      (this->super_Parser<biosoup::NucleicAcid>).buffer_bytes_ = uVar8;
      local_80 = (ulong)CONCAT31((int3)(uVar8 >> 8),
                                 (ulong)uVar8 <
                                 (ulong)((long)(this->super_Parser<biosoup::NucleicAcid>).buffer_.
                                               super__Vector_base<char,_std::allocator<char>_>.
                                               _M_impl.super__Vector_impl_data._M_finish -
                                        (long)(this->super_Parser<biosoup::NucleicAcid>).buffer_.
                                              super__Vector_base<char,_std::allocator<char>_>.
                                              _M_impl.super__Vector_impl_data._M_start));
      iVar7 = 0;
    }
LAB_0010804e:
    pvVar5 = local_90;
    if (iVar7 != 0) {
      if (iVar7 == 3) {
        if ((this->super_Parser<biosoup::NucleicAcid>).storage_ptr_ != 0) {
          Parse::anon_class_56_7_9b2cff2a::operator()(&local_68);
        }
      }
      else if ((local_88 & 1) == 0) {
        std::
        vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
        ::~vector(local_90);
      }
      return pvVar5;
    }
  } while( true );
}

Assistant:

std::vector<std::unique_ptr<T>> Parse(
      std::uint64_t bytes, bool shorten_names = true) override {
    std::vector<std::unique_ptr<T>> dst;
    std::uint64_t parsed_bytes = 0;
    std::uint32_t data_ptr = 0;
    std::uint32_t comment_ptr = 0;
    std::uint32_t quality_ptr = 0;

    auto create_T = [&] () -> void {
      if (data_ptr == 0 || comment_ptr == 0 || quality_ptr == 0) {
        throw std::invalid_argument(
            "[bioparser::FastqParser] error: invalid file format");
      }

      auto name_len = shorten_names ?
          this->Shorten(this->storage().data(), data_ptr) :
          this->RightStrip(this->storage().data(), data_ptr);

      auto data_len = comment_ptr - data_ptr;

      auto quality_len = this->storage_ptr() - quality_ptr;

      if (name_len == 0 || this->storage()[0] != '@' || data_len == 0 ||
          quality_len == 0 || data_len != quality_len) {
        throw std::invalid_argument(
            "[bioparser::FastqParser] error: invalid file format");
      }

      dst.emplace_back(std::unique_ptr<T>(new T(
          static_cast<const char*>(this->storage().data() + 1), name_len - 1,
          static_cast<const char*>(this->storage().data() + data_ptr), data_len,
          static_cast<const char*>(this->storage().data() + quality_ptr), quality_len)));  // NOLINT

      parsed_bytes += this->storage_ptr();
      data_ptr = 0;
      comment_ptr = 0;
      quality_ptr = 0;
      this->Clear();
    };

    bool is_eof = false;
    bool is_name = true;
    bool is_data = false;
    bool is_comment = false;
    bool is_quality = false;

    while (true) {
      auto buffer_ptr = this->buffer_ptr();
      for (; buffer_ptr < this->buffer_bytes(); ++buffer_ptr) {
        auto c = this->buffer()[buffer_ptr];
        if (c == '\n') {
          this->Store(buffer_ptr - this->buffer_ptr(), !is_name);
          if (is_name) {
            is_name = false;
            is_data = true;
            data_ptr = this->storage_ptr();
          } else if (is_comment) {
            is_comment = false;
            is_quality = true;
            quality_ptr = this->storage_ptr();
          } else if (is_quality &&
                this->storage_ptr() - quality_ptr == comment_ptr - data_ptr) {
            is_quality = false;
            is_name = true;
            create_T();
            if (parsed_bytes >= bytes) {
              return dst;
            }
          }
        } else if (is_data && c == '+') {
          is_data = false;
          is_comment = true;
          comment_ptr = this->storage_ptr();
        }
      }
      if (this->buffer_ptr() < buffer_ptr) {
        this->Store(buffer_ptr - this->buffer_ptr(), !is_name);
      }

      if (is_eof) {
        break;
      }
      is_eof = this->Read();
    }

    if (this->storage_ptr() != 0) {
      create_T();
    }

    return dst;
  }